

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

SchemaType * __thiscall
CoreML::Model::inputSchema_abi_cxx11_(SchemaType *__return_storage_ptr__,Model *this)

{
  element_type *this_00;
  string *__x;
  FeatureType *__y;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType>
  local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>
  local_78;
  FeatureDescription *local_48;
  FeatureDescription *desc;
  int local_38;
  int i;
  int size;
  ModelDescription *local_28;
  ModelDescription *interface;
  Model *local_18;
  Model *this_local;
  SchemaType *inputs;
  
  interface._7_1_ = 0;
  local_18 = this;
  this_local = (Model *)__return_storage_ptr__;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_spec);
  local_28 = Specification::Model::description(this_00);
  local_38 = Specification::ModelDescription::input_size(local_28);
  if (local_38 < 0) {
    __assert_fail("size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/Model.cpp"
                  ,0xba,"SchemaType CoreML::Model::inputSchema() const");
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
  ::reserve(__return_storage_ptr__,(long)local_38);
  for (desc._4_4_ = 0; desc._4_4_ < local_38; desc._4_4_ = desc._4_4_ + 1) {
    local_48 = Specification::ModelDescription::input(local_28,desc._4_4_);
    __x = Specification::FeatureDescription::name_abi_cxx11_(local_48);
    __y = Specification::FeatureDescription::type(local_48);
    std::make_pair<std::__cxx11::string_const&,CoreML::Specification::FeatureType_const&>
              (&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
               __y);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType,_true>
              (&local_78,&local_c0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
    ::push_back(__return_storage_ptr__,&local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>
    ::~pair(&local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType>
    ::~pair(&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

SchemaType Model::inputSchema() const {
        SchemaType inputs;
        const Specification::ModelDescription& interface = m_spec->description();
        int size = interface.input_size();
        assert(size >= 0);
        inputs.reserve(static_cast<size_t>(size));
        for (int i = 0; i < size; i++) {
            const Specification::FeatureDescription &desc = interface.input(i);
            inputs.push_back(std::make_pair(desc.name(), desc.type()));
        }
        return inputs;
    }